

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

uint8_t skipdata_size(cs_struct *handle)

{
  switch(handle->arch) {
  case CS_ARCH_ARM:
    return ((handle->mode & CS_MODE_MICRO) == CS_MODE_ARM) * '\x02' + '\x02';
  case CS_ARCH_ARM64:
  case CS_ARCH_MIPS:
  case CS_ARCH_PPC:
  case CS_ARCH_SPARC:
    return '\x04';
  case CS_ARCH_X86:
    return '\x01';
  case CS_ARCH_SYSZ:
  case CS_ARCH_XCORE:
    return '\x02';
  default:
    return 0xff;
  }
}

Assistant:

static uint8_t skipdata_size(cs_struct *handle)
{
	switch(handle->arch) {
		default:
			// should never reach
			return -1;
		case CS_ARCH_ARM:
			// skip 2 bytes on Thumb mode.
			if (handle->mode & CS_MODE_THUMB)
				return 2;
			// otherwise, skip 4 bytes
			return 4;
		case CS_ARCH_ARM64:
		case CS_ARCH_MIPS:
		case CS_ARCH_PPC:
		case CS_ARCH_SPARC:
			// skip 4 bytes
			return 4;
		case CS_ARCH_SYSZ:
			// SystemZ instruction's length can be 2, 4 or 6 bytes,
			// so we just skip 2 bytes
			return 2;
		case CS_ARCH_X86:
			// X86 has no restriction on instruction alignment
			return 1;
		case CS_ARCH_XCORE:
			// XCore instruction's length can be 2 or 4 bytes,
			// so we just skip 2 bytes
			return 2;
	}
}